

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O0

size_t bpkiShareDec(octet *share,size_t *share_len,octet *pki,size_t count)

{
  octet **ppoVar1;
  size_t sVar2;
  octet *der;
  der_anchor_t *anchor;
  size_t sVar3;
  size_t sVar4;
  undefined8 *in_RSI;
  size_t t_7;
  size_t t_6;
  size_t t_5;
  size_t t_4;
  size_t t_3;
  size_t t_2;
  size_t t_1;
  size_t len;
  size_t t;
  octet *ptr;
  der_anchor_t BelsAlgId [1];
  der_anchor_t PKI [1];
  size_t in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  u32 tag;
  size_t in_stack_ffffffffffffff58;
  octet *in_stack_ffffffffffffff60;
  der_anchor_t *in_stack_ffffffffffffff68;
  octet *der_00;
  undefined8 local_80;
  size_t local_78;
  octet *local_8;
  
  tag = (u32)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_8 = (octet *)derTSEQDecStart(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                     in_stack_ffffffffffffff58,tag);
  if (local_8 == (octet *)0xffffffffffffffff) {
    local_8 = (octet *)0xffffffffffffffff;
  }
  else {
    der_00 = local_8;
    sVar2 = derTSIZEDec2(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,tag,
                         in_stack_ffffffffffffff48);
    if (sVar2 == 0xffffffffffffffff) {
      local_8 = (octet *)0xffffffffffffffff;
    }
    else {
      local_8 = local_8 + sVar2;
      der = (octet *)derTSEQDecStart(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                     in_stack_ffffffffffffff58,tag);
      if (der == (octet *)0xffffffffffffffff) {
        local_8 = (octet *)0xffffffffffffffff;
      }
      else {
        local_8 = der + (long)local_8;
        anchor = (der_anchor_t *)derOIDDec2(der_00,sVar2,(char *)der);
        if (anchor == (der_anchor_t *)0xffffffffffffffff) {
          local_8 = (octet *)0xffffffffffffffff;
        }
        else {
          ppoVar1 = &anchor->der;
          local_78 = derOIDDec2(der_00,sVar2,(char *)der);
          if (local_78 == 0xffffffffffffffff) {
            local_78 = derOIDDec2(der_00,sVar2,(char *)der);
            if (local_78 == 0xffffffffffffffff) {
              local_78 = derOIDDec2(der_00,sVar2,(char *)der);
              if (local_78 == 0xffffffffffffffff) {
                return 0xffffffffffffffff;
              }
              local_80 = 0x21;
            }
            else {
              local_80 = 0x19;
            }
          }
          else {
            local_80 = 0x11;
          }
          sVar2 = derTSEQDecStop(der,anchor);
          if (sVar2 == 0xffffffffffffffff) {
            local_8 = (octet *)0xffffffffffffffff;
          }
          else {
            sVar3 = derTOCTDec2(der,(octet *)anchor,sVar2,tag,in_stack_ffffffffffffff48);
            if (sVar3 == 0xffffffffffffffff) {
              local_8 = (octet *)0xffffffffffffffff;
            }
            else {
              sVar4 = derTSEQDecStop(der,anchor);
              if (sVar4 == 0xffffffffffffffff) {
                local_8 = (octet *)0xffffffffffffffff;
              }
              else {
                local_8 = local_8 + (long)ppoVar1 + sVar4 + sVar3 + sVar2 + local_78;
                if (in_RSI != (undefined8 *)0x0) {
                  *in_RSI = local_80;
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

static size_t bpkiShareDec(octet share[], size_t* share_len,
	const octet pki[], size_t count)
{
	der_anchor_t PKI[1];
	der_anchor_t BelsAlgId[1];
	const octet* ptr = pki;
	size_t t, len;
	// декодировать
	derDecStep(derSEQDecStart(PKI, ptr, count), ptr, count);
	 derDecStep(derSIZEDec2(ptr, count, 0), ptr, count);
	 derDecStep(derSEQDecStart(BelsAlgId, ptr, count), ptr, count);
	  derDecStep(derOIDDec2(ptr, count, oid_bels_share), ptr, count);
	  if ((t = derOIDDec2(ptr, count, oid_bels_m0128v1)) != SIZE_MAX)
		  len = 17;
	  else if ((t = derOIDDec2(ptr, count, oid_bels_m0192v1)) != SIZE_MAX)
		  len = 25;
	  else if ((t = derOIDDec2(ptr, count, oid_bels_m0256v1)) != SIZE_MAX)
		  len = 33;
	  else
		  return SIZE_MAX;
	  ptr += t, count -= t;
	 derDecStep(derSEQDecStop(ptr, BelsAlgId), ptr, count);
	 derDecStep(derOCTDec2(share, ptr, count, len), ptr, count);
	derDecStep(derSEQDecStop(ptr, PKI), ptr, count);
	// возвратить длину частичного секрета
	if (share_len)
	{
		ASSERT(memIsValid(share_len, O_PER_S));
		*share_len = len;
	}
	// возвратить точную длину DER-кода
	return ptr - pki;
}